

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O3

uint64_t band(gkc_summary *s,uint64_t delta)

{
  ulong uVar1;
  double in_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  
  auVar3._8_4_ = (int)((ulong)s >> 0x20);
  auVar3._0_8_ = s;
  auVar3._12_4_ = 0x45300000;
  dVar4 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)s) - 4503599627370496.0)) * in_XMM0_Qa;
  auVar2._8_4_ = (int)(delta >> 0x20);
  auVar2._0_8_ = delta;
  auVar2._12_4_ = 0x45300000;
  dVar4 = (dVar4 + dVar4 + 1.0) -
          ((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)delta) - 4503599627370496.0));
  uVar1 = (ulong)dVar4;
  uVar1 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  if (uVar1 == 1) {
    return 0;
  }
  uVar1 = uVar1 >> 1 | uVar1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = uVar1 >> 0x20 | uVar1;
  return *(uint64_t *)
          (ullog2_magic_table + ((~(uVar1 >> 1) & uVar1) * 0x22fdd63cc95386d >> 0x3a) * 8);
}

Assistant:

static uint64_t band(struct gkc_summary *s, uint64_t delta)
{
    uint64_t diff;

    diff = 1 + (s->epsilon * s->nr_elems * 2) - delta;

    if (diff == 1) {
        return 0;
    } else {
        return ullog2(diff)/ullog2(2);
    }
}